

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListBuilder *
capnp::_::WireHelpers::initStructListPointer
          (ListBuilder *__return_storage_ptr__,WirePointer *ref,SegmentBuilder *segment,
          CapTableBuilder *capTable,ElementCount elementCount,StructSize elementSize,
          BuilderArena *orphanArena)

{
  unsigned_long uVar1;
  WirePointer *this;
  word *ptr;
  unsigned_long local_40;
  unsigned_long wordCount;
  WordsPerElementN<17> wordsPerElement;
  ElementCount local_2c;
  uint checkedElementCount;
  ElementCount elementCount_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder *segment_local;
  WirePointer *ref_local;
  StructSize elementSize_local;
  
  local_2c = elementCount;
  _checkedElementCount = capTable;
  capTable_local = (CapTableBuilder *)segment;
  segment_local = (SegmentBuilder *)ref;
  ref_local._4_4_ = elementSize;
  wordsPerElement =
       assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::initStructListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::StructSize,capnp::_::BuilderArena*)::_lambda()_1_>
                 (elementCount,(anon_class_1_0_00000001 *)((long)&wordCount + 7));
  wordCount._0_4_ = StructSize::total((StructSize *)((long)&ref_local + 4));
  uVar1 = upgradeBound<unsigned_long,unsigned_int>(wordsPerElement);
  local_40 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::initStructListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::StructSize,capnp::_::BuilderArena*)::_lambda()_2_>
                       (uVar1 * (WordCountN<17>)wordCount,
                        (anon_class_1_0_00000001 *)((long)&ptr + 7));
  this = (WirePointer *)
         allocate((WirePointer **)&segment_local,(SegmentBuilder **)&capTable_local,
                  _checkedElementCount,(int)local_40 + 1,LIST,orphanArena);
  WirePointer::ListRef::setInlineComposite
            ((ListRef *)((long)&(segment_local->super_SegmentReader).arena + 4),
             (WordCountN<29>)local_40);
  WirePointer::setKindAndInlineCompositeListElementCount(this,STRUCT,wordsPerElement);
  WirePointer::StructRef::set(&(this->field_1).structRef,ref_local._4_4_);
  ListBuilder::ListBuilder
            (__return_storage_ptr__,(SegmentBuilder *)capTable_local,_checkedElementCount,this + 1,
             (WordCountN<17>)wordCount << 6,wordsPerElement,((uint)ref_local._4_4_ & 0xffff) << 6,
             ref_local._6_2_,INLINE_COMPOSITE);
  return __return_storage_ptr__;
}

Assistant:

static KJ_ALWAYS_INLINE(ListBuilder initStructListPointer(
      WirePointer* ref, SegmentBuilder* segment, CapTableBuilder* capTable,
      ElementCount elementCount, StructSize elementSize, BuilderArena* orphanArena = nullptr)) {
    auto checkedElementCount = assertMaxBits<LIST_ELEMENT_COUNT_BITS>(elementCount,
        []() { KJ_FAIL_REQUIRE("tried to allocate list with too many elements"); });

    WordsPerElementN<17> wordsPerElement = elementSize.total() / ELEMENTS;

    // Allocate the list, prefixed by a single WirePointer.
    auto wordCount = assertMax<kj::maxValueForBits<SEGMENT_WORD_COUNT_BITS>() - 1>(
        upgradeBound<uint64_t>(checkedElementCount) * wordsPerElement,
        []() { KJ_FAIL_REQUIRE("total size of struct list is larger than max segment size"); });
    word* ptr = allocate(ref, segment, capTable, POINTER_SIZE_IN_WORDS + wordCount,
                         WirePointer::LIST, orphanArena);

    // Initialize the pointer.
    // INLINE_COMPOSITE lists replace the element count with the word count.
    ref->listRef.setInlineComposite(wordCount);

    // Initialize the list tag.
    reinterpret_cast<WirePointer*>(ptr)->setKindAndInlineCompositeListElementCount(
        WirePointer::STRUCT, checkedElementCount);
    reinterpret_cast<WirePointer*>(ptr)->structRef.set(elementSize);
    ptr += POINTER_SIZE_IN_WORDS;

    // Build the ListBuilder.
    return ListBuilder(segment, capTable, ptr, wordsPerElement * BITS_PER_WORD, checkedElementCount,
                       elementSize.data * BITS_PER_WORD, elementSize.pointers,
                       ElementSize::INLINE_COMPOSITE);
  }